

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_column_mapper.cpp
# Opt level: O2

unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true> __thiscall
duckdb::TryCastTableFilter
          (duckdb *this,TableFilter *global_filter,MultiFileIndexMapping *mapping,
          LogicalType *target_type)

{
  TableFilterType value;
  pointer puVar1;
  bool bVar2;
  ConjunctionAndFilter *pCVar3;
  pointer pCVar4;
  DynamicFilter *pDVar5;
  DynamicFilterData *pDVar6;
  pthread_mutex_t *__mutex;
  type global_filter_00;
  ConstantFilter *pCVar7;
  ConjunctionOrFilter *pCVar8;
  pointer pCVar9;
  OptionalFilter *pOVar10;
  type pTVar11;
  StructFilter *pSVar12;
  iterator iVar13;
  type mapping_00;
  child_list_t<LogicalType> *this_00;
  const_reference pvVar14;
  InFilter *pIVar15;
  reference source;
  NotImplementedException *this_01;
  Value *pVVar16;
  unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true> *it;
  shared_ptr<duckdb::DynamicFilterData,_true> *this_02;
  pointer puVar17;
  Value *this_03;
  _Head_base<0UL,_duckdb::TableFilter_*,_false> local_a0;
  Value new_constant;
  undefined8 local_58;
  string local_50;
  
  value = global_filter->filter_type;
  switch(value) {
  case CONSTANT_COMPARISON:
    pCVar7 = TableFilter::Cast<duckdb::ConstantFilter>(global_filter);
    Value::Value(&new_constant,&pCVar7->constant);
    bVar2 = StatisticsPropagator::CanPropagateCast(&(pCVar7->constant).type_,target_type);
    if ((bVar2) && (bVar2 = Value::DefaultTryCastAs(&new_constant,target_type,false), bVar2)) {
      make_uniq<duckdb::ConstantFilter,duckdb::ExpressionType_const&,duckdb::Value>
                ((duckdb *)&local_a0,&(pCVar7->super_TableFilter).field_0x9,&new_constant);
      *(TableFilter **)this = local_a0._M_head_impl;
    }
    else {
      *(undefined8 *)this = 0;
    }
    Value::~Value(&new_constant);
    return (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>)this;
  case IS_NULL:
  case IS_NOT_NULL:
    (*global_filter->_vptr_TableFilter[4])(this);
    return (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>)this;
  case CONJUNCTION_OR:
    pCVar8 = TableFilter::Cast<duckdb::ConjunctionOrFilter>(global_filter);
    make_uniq<duckdb::ConjunctionOrFilter>();
    puVar1 = (pCVar8->super_ConjunctionFilter).child_filters.
             super_vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar17 = (pCVar8->super_ConjunctionFilter).child_filters.
                   super_vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
                   .
                   super__Vector_base<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar17 != puVar1;
        puVar17 = puVar17 + 1) {
      pTVar11 = unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>::
                operator*(puVar17);
      TryCastTableFilter((duckdb *)&local_a0,pTVar11,mapping,target_type);
      if (local_a0._M_head_impl == (TableFilter *)0x0) goto LAB_0163dd44;
      pCVar9 = unique_ptr<duckdb::ConjunctionOrFilter,_std::default_delete<duckdb::ConjunctionOrFilter>,_true>
               ::operator->((unique_ptr<duckdb::ConjunctionOrFilter,_std::default_delete<duckdb::ConjunctionOrFilter>,_true>
                             *)&new_constant);
      ::std::
      vector<duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>,std::allocator<duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>>
                ((vector<duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>,std::allocator<duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>>>
                  *)&(pCVar9->super_ConjunctionFilter).child_filters,
                 (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true> *)
                 &local_a0);
      if (local_a0._M_head_impl != (TableFilter *)0x0) {
        (*(local_a0._M_head_impl)->_vptr_TableFilter[1])();
      }
    }
    goto LAB_0163db9f;
  case CONJUNCTION_AND:
    pCVar3 = TableFilter::Cast<duckdb::ConjunctionAndFilter>(global_filter);
    make_uniq<duckdb::ConjunctionAndFilter>();
    puVar1 = (pCVar3->super_ConjunctionFilter).child_filters.
             super_vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar17 = (pCVar3->super_ConjunctionFilter).child_filters.
                   super_vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
                   .
                   super__Vector_base<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar17 != puVar1;
        puVar17 = puVar17 + 1) {
      pTVar11 = unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>::
                operator*(puVar17);
      TryCastTableFilter((duckdb *)&local_a0,pTVar11,mapping,target_type);
      if (local_a0._M_head_impl == (TableFilter *)0x0) goto LAB_0163dd44;
      pCVar4 = unique_ptr<duckdb::ConjunctionAndFilter,_std::default_delete<duckdb::ConjunctionAndFilter>,_true>
               ::operator->((unique_ptr<duckdb::ConjunctionAndFilter,_std::default_delete<duckdb::ConjunctionAndFilter>,_true>
                             *)&new_constant);
      ::std::
      vector<duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>,std::allocator<duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>>
                ((vector<duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>,std::allocator<duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>>>
                  *)&(pCVar4->super_ConjunctionFilter).child_filters,
                 (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true> *)
                 &local_a0);
      if (local_a0._M_head_impl != (TableFilter *)0x0) {
        (*(local_a0._M_head_impl)->_vptr_TableFilter[1])();
      }
    }
LAB_0163db9f:
    *(undefined8 *)this = new_constant.type_._0_8_;
    return (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>)this;
  case STRUCT_EXTRACT:
    pSVar12 = TableFilter::Cast<duckdb::StructFilter>(global_filter);
    iVar13 = ::std::
             _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::MultiFileIndexMapping,_std::default_delete<duckdb::MultiFileIndexMapping>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::MultiFileIndexMapping,_std::default_delete<duckdb::MultiFileIndexMapping>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             ::find(&(mapping->child_mapping)._M_h,&pSVar12->child_idx);
    if (iVar13.
        super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::MultiFileIndexMapping,_std::default_delete<duckdb::MultiFileIndexMapping>,_true>_>,_false>
        ._M_cur != (__node_type *)0x0) {
      mapping_00 = unique_ptr<duckdb::MultiFileIndexMapping,_std::default_delete<duckdb::MultiFileIndexMapping>,_true>
                   ::operator*((unique_ptr<duckdb::MultiFileIndexMapping,_std::default_delete<duckdb::MultiFileIndexMapping>,_true>
                                *)((long)iVar13.
                                         super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::MultiFileIndexMapping,_std::default_delete<duckdb::MultiFileIndexMapping>,_true>_>,_false>
                                         ._M_cur + 0x10));
      this_00 = StructType::GetChildTypes_abi_cxx11_(target_type);
      pvVar14 = vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                ::get<true>(this_00,mapping_00->index);
      pTVar11 = unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>::
                operator*(&pSVar12->child_filter);
      TryCastTableFilter((duckdb *)&local_a0,pTVar11,mapping_00,&pvVar14->second);
      if (local_a0._M_head_impl != (TableFilter *)0x0) {
        pvVar14 = vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                  ::get<true>(this_00,mapping_00->index);
        ::std::__cxx11::string::string((string *)&new_constant,(string *)pvVar14);
        make_uniq<duckdb::StructFilter,unsigned_long&,std::__cxx11::string,duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>>
                  ((duckdb *)&local_58,&mapping_00->index,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &new_constant,
                   (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>
                    *)&local_a0);
        *(undefined8 *)this = local_58;
        ::std::__cxx11::string::~string((string *)&new_constant);
        goto LAB_0163dd51;
      }
    }
    break;
  case OPTIONAL_FILTER:
    pOVar10 = TableFilter::Cast<duckdb::OptionalFilter>(global_filter);
    pTVar11 = unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>::
              operator*(&pOVar10->child_filter);
    TryCastTableFilter((duckdb *)&new_constant,pTVar11,mapping,target_type);
    if (new_constant.type_._0_8_ != 0) {
      make_uniq<duckdb::OptionalFilter,duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>>
                ((duckdb *)&local_a0,
                 (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true> *)
                 &new_constant);
      *(TableFilter **)this = local_a0._M_head_impl;
      local_a0._M_head_impl = (TableFilter *)new_constant.type_._0_8_;
      goto LAB_0163dd51;
    }
    break;
  case IN_FILTER:
    pIVar15 = TableFilter::Cast<duckdb::InFilter>(global_filter);
    ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
              ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&new_constant,
               &(pIVar15->values).super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>);
    pVVar16 = (Value *)new_constant.type_._0_8_;
    this_03 = (Value *)new_constant.type_._0_8_;
    if ((element_type *)new_constant.type_._0_8_ !=
        new_constant.type_.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr) {
      source = vector<duckdb::Value,_true>::get<true>
                         ((vector<duckdb::Value,_true> *)&new_constant,0);
      bVar2 = StatisticsPropagator::CanPropagateCast(&source->type_,target_type);
      pVVar16 = (Value *)new_constant.type_.type_info_.internal.
                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr;
      this_03 = (Value *)new_constant.type_._0_8_;
      if (!bVar2) goto LAB_0163dd3a;
    }
    do {
      if (this_03 == pVVar16) {
        make_uniq<duckdb::InFilter,duckdb::vector<duckdb::Value,true>>
                  ((duckdb *)&local_a0,(vector<duckdb::Value,_true> *)&new_constant);
        *(TableFilter **)this = local_a0._M_head_impl;
        goto LAB_0163dd8d;
      }
      bVar2 = Value::DefaultTryCastAs(this_03,target_type,false);
      this_03 = this_03 + 1;
    } while (bVar2);
LAB_0163dd3a:
    *(undefined8 *)this = 0;
LAB_0163dd8d:
    ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
              ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&new_constant);
    return (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>)this;
  case DYNAMIC_FILTER:
    pDVar5 = TableFilter::Cast<duckdb::DynamicFilter>(global_filter);
    if ((pDVar5->filter_data).internal.
        super___shared_ptr<duckdb::DynamicFilterData,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      this_02 = &pDVar5->filter_data;
      pDVar6 = shared_ptr<duckdb::DynamicFilterData,_true>::operator->(this_02);
      if ((pDVar6->initialized != false) &&
         (pDVar6 = shared_ptr<duckdb::DynamicFilterData,_true>::operator->(this_02),
         (pDVar6->filter).
         super_unique_ptr<duckdb::ConstantFilter,_std::default_delete<duckdb::ConstantFilter>_>._M_t
         .
         super___uniq_ptr_impl<duckdb::ConstantFilter,_std::default_delete<duckdb::ConstantFilter>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ConstantFilter_*,_std::default_delete<duckdb::ConstantFilter>_>
         .super__Head_base<0UL,_duckdb::ConstantFilter_*,_false>._M_head_impl !=
         (ConstantFilter *)0x0)) {
        __mutex = (pthread_mutex_t *)
                  shared_ptr<duckdb::DynamicFilterData,_true>::operator->(this_02);
        ::std::mutex::lock((mutex *)&__mutex->__data);
        pDVar6 = shared_ptr<duckdb::DynamicFilterData,_true>::operator->(this_02);
        global_filter_00 =
             unique_ptr<duckdb::ConstantFilter,_std::default_delete<duckdb::ConstantFilter>,_true>::
             operator*(&pDVar6->filter);
        TryCastTableFilter(this,&global_filter_00->super_TableFilter,mapping,target_type);
        pthread_mutex_unlock(__mutex);
        return (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>)this
        ;
      }
    }
    break;
  case EXPRESSION_FILTER:
    break;
  default:
    this_01 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&new_constant,
               "Can\'t convert TableFilterType (%s) from global to local indexes",
               (allocator *)&local_a0);
    EnumUtil::ToString<duckdb::TableFilterType>(&local_50,value);
    NotImplementedException::NotImplementedException<std::__cxx11::string>
              (this_01,(string *)&new_constant,&local_50);
    __cxa_throw(this_01,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  }
  *(undefined8 *)this = 0;
  return (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>)this;
LAB_0163dd44:
  *(undefined8 *)this = 0;
  local_a0._M_head_impl = (TableFilter *)new_constant.type_._0_8_;
LAB_0163dd51:
  if (local_a0._M_head_impl == (TableFilter *)0x0) {
    return (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>)this;
  }
  (*(local_a0._M_head_impl)->_vptr_TableFilter[1])();
  return (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>)this;
}

Assistant:

static unique_ptr<TableFilter> TryCastTableFilter(const TableFilter &global_filter, MultiFileIndexMapping &mapping,
                                                  const LogicalType &target_type) {
	auto type = global_filter.filter_type;

	switch (type) {
	case TableFilterType::CONJUNCTION_OR: {
		auto &or_filter = global_filter.Cast<ConjunctionOrFilter>();
		auto res = make_uniq<ConjunctionOrFilter>();
		for (auto &it : or_filter.child_filters) {
			auto child_filter = TryCastTableFilter(*it, mapping, target_type);
			if (!child_filter) {
				return nullptr;
			}
			res->child_filters.push_back(std::move(child_filter));
		}
		return std::move(res);
	}
	case TableFilterType::CONJUNCTION_AND: {
		auto &and_filter = global_filter.Cast<ConjunctionAndFilter>();
		auto res = make_uniq<ConjunctionAndFilter>();
		for (auto &it : and_filter.child_filters) {
			auto child_filter = TryCastTableFilter(*it, mapping, target_type);
			if (!child_filter) {
				return nullptr;
			}
			res->child_filters.push_back(std::move(child_filter));
		}
		return std::move(res);
	}
	case TableFilterType::STRUCT_EXTRACT: {
		auto &struct_filter = global_filter.Cast<StructFilter>();
		auto &child_filter = struct_filter.child_filter;

		// find the corresponding local entry
		auto entry = mapping.child_mapping.find(struct_filter.child_idx);
		if (entry == mapping.child_mapping.end()) {
			// this is constant for this file - abort
			// FIXME: should be handled before
			return nullptr;
		}
		auto &struct_mapping = *entry->second;
		auto &struct_type = StructType::GetChildTypes(target_type);
		auto &child_type = struct_type[struct_mapping.index].second;
		auto new_child_filter = TryCastTableFilter(*child_filter, struct_mapping, child_type);
		if (!new_child_filter) {
			return nullptr;
		}
		auto child_name = struct_type[struct_mapping.index].first;
		return make_uniq<StructFilter>(struct_mapping.index, std::move(child_name), std::move(new_child_filter));
	}
	case TableFilterType::OPTIONAL_FILTER: {
		auto &optional_filter = global_filter.Cast<OptionalFilter>();
		auto child_result = TryCastTableFilter(*optional_filter.child_filter, mapping, target_type);
		if (!child_result) {
			return nullptr;
		}
		return make_uniq<OptionalFilter>(std::move(child_result));
	}
	case TableFilterType::DYNAMIC_FILTER: {
		// we can't transfer dynamic filters over casts directly
		// BUT we can copy the current state of the filter and push that
		// FIXME: we could solve this in a different manner as well by pushing the dynamic filter directly
		auto &dynamic_filter = global_filter.Cast<DynamicFilter>();
		if (!dynamic_filter.filter_data) {
			return nullptr;
		}
		if (!dynamic_filter.filter_data->initialized) {
			return nullptr;
		}
		if (!dynamic_filter.filter_data->filter) {
			return nullptr;
		}
		lock_guard<mutex> lock(dynamic_filter.filter_data->lock);
		return TryCastTableFilter(*dynamic_filter.filter_data->filter, mapping, target_type);
	}
	case TableFilterType::IS_NULL:
	case TableFilterType::IS_NOT_NULL:
		// these filters can just be copied as they don't depend on type
		return global_filter.Copy();
	case TableFilterType::CONSTANT_COMPARISON: {
		auto &constant_filter = global_filter.Cast<ConstantFilter>();
		auto new_constant = constant_filter.constant;
		if (!StatisticsPropagator::CanPropagateCast(constant_filter.constant.type(), target_type)) {
			// type cannot be converted - abort
			return nullptr;
		}
		if (!new_constant.DefaultTryCastAs(target_type)) {
			return nullptr;
		}
		return make_uniq<ConstantFilter>(constant_filter.comparison_type, std::move(new_constant));
	}
	case TableFilterType::IN_FILTER: {
		auto &in_filter = global_filter.Cast<InFilter>();
		auto in_list = in_filter.values;
		if (!in_list.empty() && !StatisticsPropagator::CanPropagateCast(in_list[0].type(), target_type)) {
			// type cannot be converted - abort
			return nullptr;
		}
		for (auto &val : in_list) {
			if (!val.DefaultTryCastAs(target_type)) {
				return nullptr;
			}
		}
		return make_uniq<InFilter>(std::move(in_list));
	}
	case TableFilterType::EXPRESSION_FILTER:
		// unsupported
		return nullptr;
	default:
		throw NotImplementedException("Can't convert TableFilterType (%s) from global to local indexes",
		                              EnumUtil::ToString(type));
	}
}